

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O1

void mutex_stats_emit(emitter_t *emitter,emitter_row_t *row,emitter_col_t *col_uint64_t,
                     emitter_col_t *col_uint32_t)

{
  emitter_col_t *peVar1;
  
  if ((row != (emitter_row_t *)0x0) && (emitter->output == emitter_output_table)) {
    peVar1 = (row->cols).qlh_first;
    while (peVar1 != (emitter_col_t *)0x0) {
      emitter_print_value(emitter,peVar1->justify,peVar1->width,peVar1->type,&peVar1->field_3);
      peVar1 = (peVar1->link).qre_next;
      if (peVar1 == (row->cols).qlh_first) {
        peVar1 = (emitter_col_t *)0x0;
      }
    }
    emitter_table_printf(emitter,anon_var_dwarf_6435278 + 8);
  }
  emitter_json_kv(emitter,"num_ops",emitter_type_uint64,&col_uint64_t->field_3);
  emitter_json_kv(emitter,"num_wait",emitter_type_uint64,&col_uint64_t[1].field_3);
  emitter_json_kv(emitter,"num_spin_acq",emitter_type_uint64,&col_uint64_t[2].field_3);
  emitter_json_kv(emitter,"num_owner_switch",emitter_type_uint64,&col_uint64_t[3].field_3);
  emitter_json_kv(emitter,"total_wait_time",emitter_type_uint64,&col_uint64_t[4].field_3);
  emitter_json_kv(emitter,"max_wait_time",emitter_type_uint64,&col_uint64_t[5].field_3);
  emitter_json_kv(emitter,"max_num_thds",emitter_type_uint32,&col_uint32_t->field_3);
  return;
}

Assistant:

static void
mutex_stats_emit(emitter_t *emitter, emitter_row_t *row,
    emitter_col_t col_uint64_t[mutex_prof_num_uint64_t_counters],
    emitter_col_t col_uint32_t[mutex_prof_num_uint32_t_counters]) {
	if (row != NULL) {
		emitter_table_row(emitter, row);
	}

	mutex_prof_uint64_t_counter_ind_t k_uint64_t = 0;
	mutex_prof_uint32_t_counter_ind_t k_uint32_t = 0;

	emitter_col_t *col;

#define EMITTER_TYPE_uint32_t emitter_type_uint32
#define EMITTER_TYPE_uint64_t emitter_type_uint64
#define OP(counter, type, human, derived, base_counter)		\
	if (!derived) {                    \
		col = &col_##type[k_##type];                        \
		++k_##type;                            \
		emitter_json_kv(emitter, #counter, EMITTER_TYPE_##type,        \
		    (const void *)&col->bool_val); \
	}
	MUTEX_PROF_COUNTERS;
#undef OP
#undef EMITTER_TYPE_uint32_t
#undef EMITTER_TYPE_uint64_t
}